

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare::operator()
          (FileCompare *this,FileEntry *a,string_view b)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar4;
  difference_type __diff;
  ulong uVar3;
  
  uVar4 = b._M_len;
  uVar1 = (a->encoded_name)._M_string_length;
  uVar3 = uVar4;
  if (uVar1 < uVar4) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = memcmp((a->encoded_name)._M_dataplus._M_p,b._M_str,uVar3);
    uVar3 = (ulong)uVar2;
  }
  if ((int)uVar3 == 0) {
    uVar3 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar1 - uVar4)) {
      uVar3 = uVar1 - uVar4;
    }
    if (0x7ffffffe < (long)uVar3) {
      uVar3 = 0;
    }
  }
  return (bool)((byte)(uVar3 >> 0x1f) & 1);
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (void* p : files_to_delete_) {
    operator delete(p);
  }
}